

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randunified.cpp
# Opt level: O0

void __thiscall NaRandUnifiedFunc::ddescr_addh(NaRandUnifiedFunc *this,DimDescr *dd)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  DimDescr *__dest;
  void *in_RSI;
  long in_RDI;
  DimDescr *pNew;
  DimDescr *local_50;
  
  uVar2 = *(int *)(in_RDI + 0x28) + 1;
  *(uint *)(in_RDI + 0x28) = uVar2;
  uVar3 = CONCAT44(0,uVar2);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(0x28),0);
  if (SUB168(auVar1 * ZEXT816(0x28),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  __dest = (DimDescr *)operator_new__(uVar4);
  if (uVar3 != 0) {
    local_50 = __dest;
    do {
      DimDescr::DimDescr(local_50);
      local_50 = local_50 + 1;
    } while (local_50 != __dest + uVar3);
  }
  if (1 < *(uint *)(in_RDI + 0x28)) {
    memcpy(__dest,*(void **)(in_RDI + 0x20),(ulong)(*(int *)(in_RDI + 0x28) - 1) * 0x28);
    if (*(void **)(in_RDI + 0x20) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x20));
    }
  }
  *(DimDescr **)(in_RDI + 0x20) = __dest;
  memcpy((void *)(*(long *)(in_RDI + 0x20) + (ulong)(*(int *)(in_RDI + 0x28) - 1) * 0x28),in_RSI,
         0x28);
  return;
}

Assistant:

void
NaRandUnifiedFunc::ddescr_addh (const DimDescr& dd)
{
	DimDescr	*pNew = new DimDescr[++n_ddescr];
	if(n_ddescr > 1) {
		memcpy(pNew, ddescr, sizeof(DimDescr) * (n_ddescr - 1));
		delete[] ddescr;
	}
	ddescr = pNew;
	ddescr[n_ddescr - 1] = dd;
}